

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.c++
# Opt level: O0

void __thiscall
capnp::_::anon_unknown_130::checkEnumList<capnp::DynamicValue::Reader>
          (anon_unknown_130 *this,Reader *reader,initializer_list<const_char_*> expected)

{
  char *a;
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  ulong uVar4;
  const_iterator ppcVar5;
  ReaderFor<capnp::DynamicEnum> RVar6;
  ArrayPtr<const_char> AVar7;
  DynamicEnum e;
  DynamicEnum e_00;
  Reader local_170;
  Schema local_128;
  uint local_120;
  ArrayPtr<const_char> local_118;
  bool local_101;
  Schema SStack_100;
  bool _kj_shouldLog;
  uint16_t local_f8;
  Reader local_f0;
  Schema local_a8;
  uint local_a0;
  ArrayPtr<const_char> local_98;
  uint local_88;
  uint i;
  uint local_74;
  size_type local_70;
  Fault local_68;
  Fault f;
  ReaderFor<capnp::DynamicList> list;
  Reader *reader_local;
  initializer_list<const_char_*> expected_local;
  
  expected_local._M_array = expected._M_array;
  reader_local = reader;
  DynamicValue::Reader::as<capnp::DynamicList>((ReaderFor<capnp::DynamicList> *)&f,(Reader *)this);
  sVar3 = std::initializer_list<const_char_*>::size((initializer_list<const_char_*> *)&reader_local)
  ;
  uVar2 = DynamicList::Reader::size((Reader *)&f);
  if (sVar3 != uVar2) {
    local_70 = std::initializer_list<const_char_*>::size
                         ((initializer_list<const_char_*> *)&reader_local);
    local_74 = DynamicList::Reader::size((Reader *)&f);
    kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
              (&local_68,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
               ,0x14a,FAILED,"(expected.size()) == (list.size())","expected.size(), list.size()",
               &local_70,&local_74);
    kj::_::Debug::Fault::fatal(&local_68);
  }
  local_88 = 0;
  while( true ) {
    uVar4 = (ulong)local_88;
    sVar3 = std::initializer_list<const_char_*>::size
                      ((initializer_list<const_char_*> *)&reader_local);
    if (sVar3 <= uVar4) break;
    ppcVar5 = std::initializer_list<const_char_*>::begin
                        ((initializer_list<const_char_*> *)&reader_local);
    a = ppcVar5[local_88];
    DynamicList::Reader::operator[](&local_f0,(Reader *)&f,local_88);
    RVar6 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_f0);
    e._8_8_ = RVar6._8_8_;
    SStack_100.raw = (RawBrandedSchema *)RVar6.schema.super_Schema.raw;
    local_f8 = RVar6.value;
    local_a0 = CONCAT22(local_a0._2_2_,local_f8);
    e.schema.super_Schema.raw._4_4_ = 0;
    e.schema.super_Schema.raw._0_4_ = local_a0;
    local_a8.raw = SStack_100.raw;
    AVar7 = (ArrayPtr<const_char>)name((anon_unknown_130 *)SStack_100.raw,e);
    local_98 = AVar7;
    bVar1 = kj::operator==(a,(StringPtr *)&local_98);
    DynamicValue::Reader::~Reader(&local_f0);
    if (!bVar1) {
      local_101 = kj::_::Debug::shouldLog(ERROR);
      while (local_101 != false) {
        ppcVar5 = std::initializer_list<const_char_*>::begin
                            ((initializer_list<const_char_*> *)&reader_local);
        uVar4 = (ulong)local_88;
        DynamicList::Reader::operator[](&local_170,(Reader *)&f,local_88);
        RVar6 = DynamicValue::Reader::as<capnp::DynamicEnum>(&local_170);
        e_00._8_8_ = RVar6._8_8_;
        local_128.raw = (RawBrandedSchema *)RVar6.schema.super_Schema.raw;
        local_120 = CONCAT22(local_120._2_2_,RVar6.value);
        e_00.schema.super_Schema.raw._4_4_ = 0;
        e_00.schema.super_Schema.raw._0_4_ = local_120;
        AVar7 = (ArrayPtr<const_char>)name((anon_unknown_130 *)local_128.raw,e_00);
        local_118 = AVar7;
        kj::_::Debug::log<char_const(&)[85],char_const*const&,capnp::Text::Reader>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.c++"
                   ,0x14c,ERROR,
                   "\"failed: expected \" \"(expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))\", expected.begin()[i], name(list[i].template as<DynamicEnum>())"
                   ,(char (*) [85])
                    "failed: expected (expected.begin()[i]) == (name(list[i].template as<DynamicEnum>()))"
                   ,ppcVar5 + uVar4,(Reader *)&local_118);
        DynamicValue::Reader::~Reader(&local_170);
        local_101 = false;
      }
    }
    local_88 = local_88 + 1;
  }
  return;
}

Assistant:

void checkEnumList(T reader, std::initializer_list<const char*> expected) {
  auto list = reader.as<DynamicList>();
  ASSERT_EQ(expected.size(), list.size());
  for (uint i = 0; i < expected.size(); i++) {
    EXPECT_EQ(expected.begin()[i], name(list[i].as<DynamicEnum>()));
  }
}